

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void vmsa_ttbcr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  long lVar1;
  CPUARMState_conflict *__mptr;
  
  lVar1 = ri->fieldoffset;
  if ((env->features & 0x4000000) != 0) {
    tlb_flush_aarch64((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14));
  }
  vmsa_ttbcr_raw_write
            (env,ri,value & 0xffffffff | (ulong)*(uint *)((long)env->regs + lVar1 + 4) << 0x20);
  return;
}

Assistant:

static void vmsa_ttbcr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                             uint64_t value)
{
    ARMCPU *cpu = env_archcpu(env);
    TCR *tcr = raw_ptr(env, ri);

    if (arm_feature(env, ARM_FEATURE_LPAE)) {
        /* With LPAE the TTBCR could result in a change of ASID
         * via the TTBCR.A1 bit, so do a TLB flush.
         */
        tlb_flush(CPU(cpu));
    }
    /* Preserve the high half of TCR_EL1, set via TTBCR2.  */
    value = deposit64(tcr->raw_tcr, 0, 32, value);
    vmsa_ttbcr_raw_write(env, ri, value);
}